

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseExpression(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  bool bVar11;
  bool bVar12;
  State copy;
  
  bVar11 = ParseTemplateParam(state);
  bVar12 = true;
  if ((!bVar11) && (bVar11 = ParseExprPrimary(state), !bVar11)) {
    pcVar2 = state->mangled_cur;
    pcVar3 = state->out_cur;
    pcVar4 = state->out_begin;
    pcVar5 = state->out_end;
    pcVar6 = state->prev_name;
    uVar7 = state->prev_name_length;
    uVar8 = state->nest_level;
    uVar9 = state->append;
    uVar10 = state->overflowed;
    bVar11 = ParseOperatorName(state);
    if ((bVar11) &&
       (((bVar11 = ParseExpression(state), bVar11 && (bVar11 = ParseExpression(state), bVar11)) &&
        (bVar11 = ParseExpression(state), bVar11)))) {
      return true;
    }
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    bVar11 = ParseOperatorName(state);
    if (((bVar11) && (bVar11 = ParseExpression(state), bVar11)) &&
       (bVar11 = ParseExpression(state), bVar11)) {
      return true;
    }
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    bVar11 = ParseOperatorName(state);
    if ((bVar11) && (bVar11 = ParseExpression(state), bVar11)) {
      return true;
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 's') && (pcVar1[1] == 't')) {
      state->mangled_cur = pcVar1 + 2;
      bVar11 = ParseType(state);
      if (bVar11) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 's') && (pcVar1[1] == 'r')) {
      state->mangled_cur = pcVar1 + 2;
      bVar11 = ParseType(state);
      if ((bVar11) &&
         ((bVar11 = ParseUnqualifiedName(state), bVar11 &&
          (bVar11 = ParseTemplateArgs(state), bVar11)))) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 's') && (pcVar1[1] == 'r')) {
      state->mangled_cur = pcVar1 + 2;
      bVar11 = ParseType(state);
      if ((bVar11) && (bVar11 = ParseUnqualifiedName(state), bVar11)) {
        return true;
      }
    }
    bVar12 = false;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
  }
  return bVar12;
}

Assistant:

static bool ParseExpression(State *state) {
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  State copy = *state;
  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}